

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O3

void __thiscall
gmath::RationalTangentialThinPrismDistortion::invTransform
          (RationalTangentialThinPrismDistortion *this,double *xd,double *yd,double xx,double yy)

{
  long ltmp [2];
  double fvec [2];
  double x [2];
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_a0;
  double dtmp [16];
  
  local_108 = this->kd[0];
  dStack_100 = this->kd[1];
  local_f8 = this->kd[2];
  dStack_f0 = this->kd[3];
  local_e8 = this->kd[4];
  dStack_e0 = this->kd[5];
  local_d8 = this->kd[6];
  dStack_d0 = this->kd[7];
  local_c8 = this->kd[8];
  dStack_c0 = this->kd[9];
  local_b8 = this->kd[10];
  dStack_b0 = this->kd[0xb];
  ltmp[0] = 0;
  ltmp[1] = 0;
  dtmp[0xe] = 0.0;
  dtmp[0xf] = 0.0;
  dtmp[0xc] = 0.0;
  dtmp[0xd] = 0.0;
  dtmp[10] = 0.0;
  dtmp[0xb] = 0.0;
  dtmp[8] = 0.0;
  dtmp[9] = 0.0;
  dtmp[6] = 0.0;
  dtmp[7] = 0.0;
  dtmp[4] = 0.0;
  dtmp[5] = 0.0;
  dtmp[2] = 0.0;
  dtmp[3] = 0.0;
  dtmp[0] = 0.0;
  dtmp[1] = 0.0;
  x[0] = xx;
  x[1] = yy;
  local_a8 = xx;
  local_a0 = yy;
  slmdif(anon_unknown_0::computeRationalTangentialThinPrismDistortion,2,2,x,fvec,&local_108,1e-06,
         0.0,ltmp,dtmp);
  *xd = x[0];
  *yd = x[1];
  return;
}

Assistant:

void RationalTangentialThinPrismDistortion::invTransform(double &xd, double &yd, double xx, double yy) const
{
  double x[2]= {xx, yy};

  RationalTangentialThinPrismDistortionParameter param;

  param.p1=kd[0];
  param.p2=kd[1];

  param.kd[0]=kd[2];
  param.kd[1]=kd[3];
  param.kd[2]=kd[4];
  param.kd[3]=kd[5];
  param.kd[4]=kd[6];
  param.kd[5]=kd[7];

  param.s[0]=kd[8];
  param.s[1]=kd[9];
  param.s[2]=kd[10];
  param.s[3]=kd[11];

  param.xd=xx;
  param.yd=yy;

  double fvec[2];

  long ltmp[2]= {0, 0};
  double dtmp[16];

  memset(dtmp, 0, 16*sizeof(double));
  gmath::slmdif(computeRationalTangentialThinPrismDistortion, 2, 2, x, fvec, &param, 1e-6, 0, ltmp, dtmp);

  xd=x[0];
  yd=x[1];
}